

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O1

void __thiscall QEvdevKeyboardManager::loadKeymap(QEvdevKeyboardManager *this,QString *file)

{
  pointer pDVar1;
  QEvdevKeyboardHandler *this_00;
  int *piVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  char cVar7;
  CutResult CVar8;
  qsizetype qVar9;
  QChar *pQVar10;
  long lVar11;
  long lVar12;
  Device *keyboard_1;
  pointer pDVar13;
  Device *keyboard;
  long in_FS_OFFSET;
  QStringView QVar14;
  QLatin1String QVar15;
  QString local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  QString local_58;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(&this->m_defaultKeymapFile,file);
  if ((file->d).size == 0) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    local_98.d.ptr = (this->m_spec).d.ptr;
    local_98.d.d = (Data *)(this->m_spec).d.size;
    QStringView::split(&local_78,&local_98,0x3a,0,1);
    if (local_68 != (undefined1 *)0x0) {
      lVar3 = CONCAT44(uStack_6c,uStack_70);
      lVar12 = (long)local_68 << 4;
      lVar11 = 0;
      do {
        QVar14.m_data = *(storage_type_conflict **)(lVar3 + 8 + lVar11);
        QVar14.m_size = *(qsizetype *)(lVar3 + lVar11);
        QVar15.m_data = "keymap=";
        QVar15.m_size = 7;
        cVar7 = QtPrivate::startsWith(QVar14,QVar15,CaseSensitive);
        if (cVar7 != '\0') {
          local_98.d.d = (Data *)0x7;
          local_40 = -1;
          CVar8 = QtPrivate::QContainerImplHelper::mid
                            (*(qsizetype *)(lVar3 + lVar11),(qsizetype *)&local_98,&local_40);
          if (CVar8 == Null) {
            qVar9 = 0;
            pQVar10 = (QChar *)0x0;
          }
          else {
            pQVar10 = (QChar *)((long)local_98.d.d * 2 + *(long *)(lVar3 + 8 + lVar11));
            qVar9 = local_40;
          }
          QString::QString(&local_98,pQVar10,qVar9);
          pcVar6 = local_58.d.ptr;
          pDVar5 = local_58.d.d;
          qVar9 = local_98.d.size;
          pDVar4 = local_98.d.d;
          local_98.d.d = local_58.d.d;
          local_58.d.d = pDVar4;
          local_58.d.ptr = local_98.d.ptr;
          local_98.d.ptr = pcVar6;
          local_98.d.size = local_58.d.size;
          local_58.d.size = qVar9;
          if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
            }
          }
        }
        lVar11 = lVar11 + 0x10;
      } while (lVar12 != lVar11);
    }
    pDVar13 = (this->m_keyboards).v.
              super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar1 = (this->m_keyboards).v.
             super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pDVar13 != pDVar1) {
      do {
        this_00 = (pDVar13->handler)._M_t.
                  super___uniq_ptr_impl<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QEvdevKeyboardHandler_*,_std::default_delete<QEvdevKeyboardHandler>_>
                  .super__Head_base<0UL,_QEvdevKeyboardHandler_*,_false>._M_head_impl;
        if (local_58.d.size == 0) {
          QEvdevKeyboardHandler::unloadKeymap(this_00);
        }
        else {
          QEvdevKeyboardHandler::loadKeymap(this_00,&local_58);
        }
        pDVar13 = pDVar13 + 1;
      } while (pDVar13 != pDVar1);
    }
    piVar2 = (int *)CONCAT44(uStack_74,local_78);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),0x10,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pDVar1 = (this->m_keyboards).v.
             super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar13 = (this->m_keyboards).v.
                   super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar13 != pDVar1;
        pDVar13 = pDVar13 + 1) {
      QEvdevKeyboardHandler::loadKeymap
                ((pDVar13->handler)._M_t.
                 super___uniq_ptr_impl<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QEvdevKeyboardHandler_*,_std::default_delete<QEvdevKeyboardHandler>_>
                 .super__Head_base<0UL,_QEvdevKeyboardHandler_*,_false>._M_head_impl,file);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevKeyboardManager::loadKeymap(const QString &file)
{
    m_defaultKeymapFile = file;

    if (file.isEmpty()) {
        // Restore the default, which is either the built-in keymap or
        // the one given in the plugin spec.
        QString keymapFromSpec;
        const auto specs = QStringView{m_spec}.split(u':');
        for (const auto &arg : specs) {
            if (arg.startsWith("keymap="_L1))
                keymapFromSpec = arg.mid(7).toString();
        }
        for (const auto &keyboard : m_keyboards) {
            if (keymapFromSpec.isEmpty())
                keyboard.handler->unloadKeymap();
            else
                keyboard.handler->loadKeymap(keymapFromSpec);
        }
    } else {
        for (const auto &keyboard : m_keyboards)
            keyboard.handler->loadKeymap(file);
    }
}